

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

bool __thiscall libcellml::XmlNode::hasNamespaceDefinition(XmlNode *this,string *uri)

{
  int iVar1;
  xmlNs *pxVar2;
  xmlNs *pxVar3;
  bool bVar4;
  string href;
  allocator<char> local_51;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pxVar3 = this->mPimpl->mXmlNodePtr->nsDef;
  if (pxVar3 != (xmlNs *)0x0) {
    do {
      pxVar2 = pxVar3;
      if (pxVar2 == (xmlNs *)0x0) {
        return false;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)pxVar2->href,&local_51);
      if (local_48 == uri->_M_string_length) {
        if (local_48 == 0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp(local_50,(uri->_M_dataplus)._M_p,local_48);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      pxVar3 = pxVar2;
      if (!bVar4) {
        pxVar3 = pxVar2->next;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    } while (!bVar4);
    if (pxVar2 != (xmlNs *)0x0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool XmlNode::hasNamespaceDefinition(const std::string &uri)
{
    if (mPimpl->mXmlNodePtr->nsDef != nullptr) {
        auto next = mPimpl->mXmlNodePtr->nsDef;
        while (next != nullptr) {
            // If you have a namespace, the href cannot be empty.
            std::string href = std::string(reinterpret_cast<const char *>(next->href));
            if (href == uri) {
                return true;
            }
            next = next->next;
        }
    }
    return false;
}